

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::CreateClassInstance(SQVM *this,SQClass *theclass,SQObjectPtr *inst,SQObjectPtr *constructor)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQInstance *pSVar5;
  
  pSVar5 = SQClass::CreateInstance(theclass);
  pSVar3 = (inst->super_SQObject)._unVal.pTable;
  SVar2 = (inst->super_SQObject)._type;
  (inst->super_SQObject)._type = OT_INSTANCE;
  (inst->super_SQObject)._unVal.pInstance = pSVar5;
  pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  bVar4 = SQClass::GetConstructor(theclass,constructor);
  if (!bVar4) {
    pSVar3 = (constructor->super_SQObject)._unVal.pTable;
    SVar2 = (constructor->super_SQObject)._type;
    (constructor->super_SQObject)._type = OT_NULL;
    (constructor->super_SQObject)._unVal.pTable = (SQTable *)0x0;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return true;
}

Assistant:

bool SQVM::CreateClassInstance(SQClass *theclass, SQObjectPtr &inst, SQObjectPtr &constructor)
{
    inst = theclass->CreateInstance();
    if(!theclass->GetConstructor(constructor)) {
        constructor.Null();
    }
    return true;
}